

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

int glu::getDataTypeNumComponents(DataType dataType)

{
  bool bVar1;
  undefined4 local_c;
  DataType dataType_local;
  
  bVar1 = isDataTypeScalarOrVector(dataType);
  if (bVar1) {
    local_c = getDataTypeScalarSize(dataType);
  }
  else {
    bVar1 = isDataTypeMatrix(dataType);
    if (bVar1) {
      local_c = getDataTypeMatrixNumRows(dataType);
    }
    else {
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

int	getDataTypeNumComponents (DataType dataType)
{
	if (isDataTypeScalarOrVector(dataType))
		return getDataTypeScalarSize(dataType);
	else if (isDataTypeMatrix(dataType))
		return getDataTypeMatrixNumRows(dataType);

	DE_FATAL("Illegal datatype.");
	return 0;
}